

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O3

void __thiscall asl::XdlEncoder::XdlEncoder(XdlEncoder *this)

{
  undefined8 in_RAX;
  XdlSink *pXVar1;
  undefined8 uStack_28;
  
  (this->_out).field_2._space[0] = '\0';
  (this->_out)._size = 0;
  (this->_out)._len = 0;
  (this->_indent)._size = 0;
  (this->_indent)._len = 0;
  (this->_indent).field_2._space[0] = '\0';
  (this->_sep1)._size = 0;
  (this->_sep1)._len = 0;
  (this->_sep1).field_2._space[0] = '\0';
  (this->_sep2)._size = 0;
  (this->_sep2)._len = 0;
  (this->_sep2).field_2._space[0] = '\0';
  this->_level = 0;
  this->_pretty = false;
  this->_json = false;
  uStack_28 = in_RAX;
  String::resize(&this->_out,0x200,true,true);
  uStack_28 = CONCAT17(0x2c,(undefined7)uStack_28);
  String::operator=(&this->_sep1,(char *)((long)&uStack_28 + 7));
  uStack_28._0_7_ = CONCAT16(0x2c,(undefined6)uStack_28);
  String::operator=(&this->_sep2,(char *)((long)&uStack_28 + 6));
  this->_simple = false;
  this->_fmtF = "%.9g";
  this->_fmtD = "%.17g";
  pXVar1 = (XdlSink *)operator_new(0x10);
  pXVar1->_vptr_XdlSink = (_func_int **)&PTR__XdlSink_00150b48;
  pXVar1[1]._vptr_XdlSink = (_func_int **)this;
  this->_sink = pXVar1;
  return;
}

Assistant:

XdlEncoder::XdlEncoder()
{
	_level = 0;
	_pretty = false;
	_json = false;
	_out.resize(512);
	_sep1 = ',';
	_sep2 = ',';
	_simple = false;
	_fmtF = "%.9g";
	_fmtD = "%.17g";
	_sink = new XdlSinkString(_out);
}